

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t singleTableUsage(poptContext con,FILE *fp,columns_t columns,poptOption *opt,
                       char *translation_domain,poptDone done)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  void *that;
  poptOption *ppStack_40;
  int i;
  void *arg;
  poptDone done_local;
  char *translation_domain_local;
  poptOption *opt_local;
  columns_t columns_local;
  FILE *fp_local;
  poptContext con_local;
  
  done_local = (poptDone)translation_domain;
  translation_domain_local = (char *)opt;
  if (opt != (poptOption *)0x0) {
    while( true ) {
      bVar3 = true;
      if ((*(long *)translation_domain_local == 0) &&
         (bVar3 = true, translation_domain_local[8] == '\0')) {
        bVar3 = *(long *)(translation_domain_local + 0x10) != 0;
      }
      if (!bVar3) break;
      if ((*(uint *)(translation_domain_local + 0xc) & _poptArgMask) == 6) {
        done_local = *(poptDone *)(translation_domain_local + 0x10);
      }
      else if ((*(uint *)(translation_domain_local + 0xc) & _poptArgMask) == 4) {
        ppStack_40 = *(poptOption **)(translation_domain_local + 0x10);
        if (ppStack_40 == poptHelpOptions) {
          ppStack_40 = poptHelpOptionsI18N;
        }
        if (done != (poptDone)0x0) {
          that._4_4_ = 0;
          if (done->opts != (void **)0x0) {
            for (that._4_4_ = 0;
                (that._4_4_ < done->nopts &&
                (((poptOption *)done->opts[that._4_4_] == (poptOption *)0x0 ||
                 ((poptOption *)done->opts[that._4_4_] != ppStack_40))));
                that._4_4_ = that._4_4_ + 1) {
            }
          }
          if ((ppStack_40 == (poptOption *)0x0) || (that._4_4_ < done->nopts)) goto LAB_00109751;
          if ((done->opts != (void **)0x0) && (done->nopts < done->maxopts)) {
            iVar1 = done->nopts;
            done->nopts = iVar1 + 1;
            done->opts[iVar1] = ppStack_40;
          }
        }
        sVar2 = singleTableUsage(con,fp,columns,*(poptOption **)(translation_domain_local + 0x10),
                                 (char *)done_local,done);
        columns->cur = sVar2;
      }
      else if (((*(long *)translation_domain_local != 0) || (translation_domain_local[8] != '\0'))
              && ((*(uint *)(translation_domain_local + 0xc) & 0x40000000) == 0)) {
        sVar2 = singleOptionUsage(fp,columns,(poptOption *)translation_domain_local,
                                  (char *)done_local);
        columns->cur = sVar2;
      }
LAB_00109751:
      translation_domain_local = translation_domain_local + 0x30;
    }
  }
  return columns->cur;
}

Assistant:

static size_t singleTableUsage(poptContext con, FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char * translation_domain,
		poptDone done)
{
    if (opt != NULL)
    for (; (opt->longName || opt->shortName || opt->arg) ; opt++) {
        if (poptArgType(opt) == POPT_ARG_INTL_DOMAIN) {
	    translation_domain = (const char *)opt->arg;
	} else
	if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (done) {
		int i = 0;
		if (done->opts != NULL)
		for (i = 0; i < done->nopts; i++) {
		    const void * that = done->opts[i];
		    if (that == NULL || that != arg)
			continue;
		    break;
		}
		/* Skip if this table has already been processed. */
		if (arg == NULL || i < done->nopts)
		    continue;
		if (done->opts != NULL && done->nopts < done->maxopts)
		    done->opts[done->nopts++] = (const void *) arg;
	    }
	    columns->cur = singleTableUsage(con, fp, columns, opt->arg,
			translation_domain, done);
	} else
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN)) {
	    columns->cur = singleOptionUsage(fp, columns, opt, translation_domain);
	}
    }

    return columns->cur;
}